

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QAction::setStatusTip(QAction *this,QString *statustip)

{
  bool bVar1;
  QActionPrivate *rhs;
  QString *in_RSI;
  QActionPrivate *in_RDI;
  QActionPrivate *d;
  
  rhs = d_func((QAction *)0x97651c);
  bVar1 = ::operator==(in_RSI,(QString *)rhs);
  if (!bVar1) {
    QString::operator=(&rhs->statustip,(QString *)in_RSI);
    QActionPrivate::sendDataChanged(in_RDI);
  }
  return;
}

Assistant:

void QAction::setStatusTip(const QString &statustip)
{
    Q_D(QAction);
    if (d->statustip == statustip)
        return;

    d->statustip = statustip;
    d->sendDataChanged();
}